

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SSLWriteRetry_Test::TestBody
          (SSLVersionTest_SSLWriteRetry_Test *this)

{
  bool bVar1;
  int iVar2;
  const_iterator pbVar3;
  char *pcVar4;
  pointer psVar5;
  SSL *pSVar6;
  SSL *pSVar7;
  UniquePtr<SSL> *pUVar8;
  char *in_R9;
  AssertHelper local_840;
  Message local_838;
  int local_830;
  int local_82c;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_36;
  Message local_810;
  int local_804;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_35;
  Message local_7e8;
  int local_7e0;
  int local_7dc;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_34;
  Message local_7c0;
  int local_7b4;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_33;
  Message local_798;
  int local_790;
  int local_78c;
  undefined1 local_788 [8];
  AssertionResult gtest_ar_32;
  Message local_770;
  int local_764;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_31;
  uint i_1;
  Message local_740;
  int local_738;
  int local_734;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_30;
  AssertHelper local_700;
  Message local_6f8;
  bool local_6e9;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__4;
  Message local_6d0;
  int local_6c8;
  int local_6c4;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_29;
  Message local_6a8;
  int local_6a0;
  int local_69c;
  undefined1 local_698 [8];
  AssertionResult gtest_ar_28;
  Message local_680;
  int local_674;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_27;
  Message local_658;
  int local_650;
  int local_64c;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_26;
  Message local_630;
  int local_624;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_25;
  Message local_608;
  int local_5fc;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_24;
  Message local_5e0;
  int local_5d8;
  int local_5d4;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_23;
  Message local_5b8;
  int local_5ac;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_22;
  Message local_590;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_21;
  int ret;
  Message local_568;
  int local_560;
  int local_55c;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_20;
  Message local_540;
  int local_534;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_19;
  Message local_518;
  int local_50c;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_18;
  Message local_4f0;
  int local_4e8;
  int local_4e4;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_17;
  int ret_2;
  Message local_4c0;
  int local_4b8;
  int local_4b4;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_16;
  Message local_498;
  int local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_15;
  Message local_470;
  int local_468;
  int local_464;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_14;
  Message local_448;
  int local_43c;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_13;
  Message local_420;
  int local_418;
  int local_414;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_12;
  Message local_3f8;
  int local_3ec;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_11;
  Message local_3d0;
  int local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_10;
  char data_longer [11];
  Message local_398;
  int local_390;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_9;
  Message local_370;
  int local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_8;
  undefined1 local_348 [4];
  uint i;
  char buf [20];
  Message local_328;
  int local_320;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_2e8;
  Message local_2e0;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__3;
  Message local_2b8;
  int local_2b0;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_6;
  Message local_290;
  int local_288;
  int local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_250;
  Message local_248;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__2;
  Message local_220;
  int local_218;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_4;
  char data2 [6];
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__1;
  Message local_1a8;
  int local_1a0;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_3;
  Message local_180;
  int local_178;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  Message local_130;
  int local_128;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  uint local_108;
  int ret_1;
  uint count;
  undefined1 uStack_fc;
  char data [7];
  AssertHelper local_d8;
  Message local_d0 [3];
  ClientConfig local_b8;
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_4460;
  bool enable_partial_write;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_28;
  initializer_list<bool> *local_18;
  initializer_list<bool> *__range2;
  SSLVersionTest_SSLWriteRetry_Test *this_local;
  
  __range2 = (initializer_list<bool> *)this;
  bVar1 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
  if (!bVar1) {
    __begin2._6_1_ = 0;
    __begin2._7_1_ = 1;
    local_28._M_array = (iterator)((long)&__begin2 + 6);
    local_28._M_len = 2;
    local_18 = &local_28;
    __end2 = std::initializer_list<bool>::begin(local_18);
    pbVar3 = std::initializer_list<bool>::end(local_18);
    for (; __end2 != pbVar3; __end2 = __end2 + 1) {
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._7_1_ = *__end2 & 1;
      testing::ScopedTrace::ScopedTrace<bool>
                ((ScopedTrace *)
                 ((long)&gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 6),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x116c,(bool *)((long)&gtest_ar_.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 7));
      local_b8.verify_hostname.field_2._M_allocated_capacity = 0;
      local_b8.verify_hostname.field_2._8_8_ = 0;
      local_b8.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
      local_b8.verify_hostname._1_7_ = 0;
      local_b8.verify_hostname._M_string_length = 0;
      local_b8.servername.field_2._M_allocated_capacity = 0;
      local_b8.servername.field_2._8_8_ = 0;
      local_b8.servername._M_dataplus = (_Alloc_hider)0x0;
      local_b8.servername._1_7_ = 0;
      local_b8.servername._M_string_length = 0;
      local_b8.session = (SSL_SESSION *)0x0;
      local_b8.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
      local_b8.hostflags = 0;
      local_b8.early_data = false;
      local_b8._85_3_ = 0;
      ClientConfig::ClientConfig(&local_b8);
      local_59 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_b8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_58,&local_59,(type *)0x0);
      ClientConfig::~ClientConfig(&local_b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
      if (!bVar1) {
        testing::Message::Message(local_d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(data + 3),(internal *)local_58,(AssertionResult *)"Connect()","false",
                   "true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x116f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_d8,local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        std::__cxx11::string::~string((string *)(data + 3));
        testing::Message::~Message(local_d0);
      }
      _uStack_fc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
      if (_uStack_fc == 0) {
        if ((gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._7_1_ & 1) != 0) {
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_);
          SSL_set_mode(psVar5,1);
        }
        stack0xfffffffffffffefd = 0x6c6c6568;
        count._1_2_ = 0x216f;
        count._3_1_ = 0;
        local_108 = 0;
        while( true ) {
          pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_SSLVersionTest).client_);
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = SSL_write(pSVar6,(void *)((long)&ret_1 + 1),5);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ < 1) break;
          local_14c = 5;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_148,"ret","5",
                     (int *)((long)&gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            + 4),&local_14c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
          if (!bVar1) {
            testing::Message::Message(&local_158);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1181,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_158);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_158);
          }
          _uStack_fc = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
          if (_uStack_fc != 0) goto LAB_001cca0b;
          local_108 = local_108 + 1;
        }
        pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                  (&(this->super_SSLVersionTest).client_);
        local_124 = SSL_get_error(pSVar6,gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_);
        local_128 = 3;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_120,"SSL_get_error(client_.get(), ret)","3",&local_124,
                   &local_128);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
        if (!bVar1) {
          testing::Message::Message(&local_130);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x117e,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_1.message_,&local_130);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_130);
        }
        _uStack_fc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
        if (_uStack_fc == 0) {
          pUVar8 = &(this->super_SSLVersionTest).client_;
          pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
          iVar2 = SSL_write(pSVar7,(void *)((long)&ret_1 + 1),5);
          local_174 = SSL_get_error(pSVar6,iVar2);
          local_178 = 3;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_170,
                     "SSL_get_error(client_.get(), SSL_write(client_.get(), data, kChunkLen))","3",
                     &local_174,&local_178);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
          if (!bVar1) {
            testing::Message::Message(&local_180);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1188,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_180);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_180);
          }
          _uStack_fc = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
          if (_uStack_fc == 0) {
            pUVar8 = &(this->super_SSLVersionTest).client_;
            pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
            pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
            iVar2 = SSL_write(pSVar7,(void *)((long)&ret_1 + 1),4);
            local_19c = SSL_get_error(pSVar6,iVar2);
            local_1a0 = 1;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_198,
                       "SSL_get_error(client_.get(), SSL_write(client_.get(), data, kChunkLen - 1))"
                       ,"1",&local_19c,&local_1a0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
            if (!bVar1) {
              testing::Message::Message(&local_1a8);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x118d,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__1.message_,&local_1a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
              testing::Message::~Message(&local_1a8);
            }
            _uStack_fc = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
            if (_uStack_fc == 0) {
              local_1c1 = ExpectSingleError(0x10,0x76);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
              if (!bVar1) {
                testing::Message::Message(&local_1d0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)data2,(internal *)local_1c0,
                           (AssertionResult *)"ExpectSingleError(ERR_LIB_SSL, 118)","false","true",
                           in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1d8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x118e,pcVar4);
                testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
                testing::internal::AssertHelper::~AssertHelper(&local_1d8);
                std::__cxx11::string::~string((string *)data2);
                testing::Message::~Message(&local_1d0);
              }
              _uStack_fc = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
              if (_uStack_fc == 0) {
                gtest_ar_4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_2_ = 0x6f;
                gtest_ar_4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_4_ = 0x6c6c6568;
                pUVar8 = &(this->super_SSLVersionTest).client_;
                pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
                pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
                iVar2 = SSL_write(pSVar7,&gtest_ar_4.message_,5);
                local_214 = SSL_get_error(pSVar6,iVar2);
                local_218 = 1;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_210,
                           "SSL_get_error(client_.get(), SSL_write(client_.get(), data2, kChunkLen))"
                           ,"1",&local_214,&local_218);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_210);
                if (!bVar1) {
                  testing::Message::Message(&local_220);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1194,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__2.message_,&local_220);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_);
                  testing::Message::~Message(&local_220);
                }
                _uStack_fc = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
                if (_uStack_fc == 0) {
                  local_239 = ExpectSingleError(0x10,0x76);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_238,&local_239,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_238);
                  if (!bVar1) {
                    testing::Message::Message(&local_248);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_5.message_,(internal *)local_238,
                               (AssertionResult *)"ExpectSingleError(ERR_LIB_SSL, 118)","false",
                               "true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_250,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1195,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_250,&local_248);
                    testing::internal::AssertHelper::~AssertHelper(&local_250);
                    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
                    testing::Message::~Message(&local_248);
                  }
                  _uStack_fc = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                  if (_uStack_fc == 0) {
                    psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                       (&(this->super_SSLVersionTest).client_);
                    SSL_set_mode(psVar5,2);
                    pUVar8 = &(this->super_SSLVersionTest).client_;
                    pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
                    pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
                    iVar2 = SSL_write(pSVar7,&gtest_ar_4.message_,5);
                    local_284 = SSL_get_error(pSVar6,iVar2);
                    local_288 = 3;
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_280,
                               "SSL_get_error(client_.get(), SSL_write(client_.get(), data2, kChunkLen))"
                               ,"3",&local_284,&local_288);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_280);
                    if (!bVar1) {
                      testing::Message::Message(&local_290);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_280);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x119b,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_6.message_,&local_290);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_6.message_);
                      testing::Message::~Message(&local_290);
                    }
                    _uStack_fc = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                    if (_uStack_fc == 0) {
                      pUVar8 = &(this->super_SSLVersionTest).client_;
                      pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
                      pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(pUVar8);
                      iVar2 = SSL_write(pSVar7,&gtest_ar_4.message_,4);
                      local_2ac = SSL_get_error(pSVar6,iVar2);
                      local_2b0 = 1;
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_2a8,
                                 "SSL_get_error(client_.get(), SSL_write(client_.get(), data2, kChunkLen - 1))"
                                 ,"1",&local_2ac,&local_2b0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_2a8);
                      if (!bVar1) {
                        testing::Message::Message(&local_2b8);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_2a8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x11a0,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar__3.message_,&local_2b8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar__3.message_);
                        testing::Message::~Message(&local_2b8);
                      }
                      _uStack_fc = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
                      if (_uStack_fc == 0) {
                        local_2d1 = ExpectSingleError(0x10,0x76);
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_2d0);
                        if (!bVar1) {
                          testing::Message::Message(&local_2e0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar_7.message_,(internal *)local_2d0,
                                     (AssertionResult *)"ExpectSingleError(ERR_LIB_SSL, 118)",
                                     "false","true",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_2e8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x11a1,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
                          testing::internal::AssertHelper::~AssertHelper(&local_2e8);
                          std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
                          testing::Message::~Message(&local_2e0);
                        }
                        _uStack_fc = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
                        if (_uStack_fc == 0) {
                          pUVar8 = &(this->super_SSLVersionTest).client_;
                          pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                    (pUVar8);
                          pSVar7 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                    (pUVar8);
                          iVar2 = SSL_write(pSVar7,(void *)((long)&ret_1 + 1),6);
                          local_31c = SSL_get_error(pSVar6,iVar2);
                          local_320 = 3;
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_318,
                                     "SSL_get_error(client_.get(), SSL_write(client_.get(), data, kChunkLen + 1))"
                                     ,"3",&local_31c,&local_320);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_318);
                          if (!bVar1) {
                            testing::Message::Message(&local_328);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_318);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)(buf + 0x10),kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x11a6,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)(buf + 0x10),&local_328);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)(buf + 0x10));
                            testing::Message::~Message(&local_328);
                          }
                          _uStack_fc = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                          if (_uStack_fc == 0) {
                            for (gtest_ar_8.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_ = 0;
                                gtest_ar_8.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ < local_108;
                                gtest_ar_8.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ =
                                     gtest_ar_8.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_ + 1) {
                              pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                        (&(this->super_SSLVersionTest).server_);
                              local_364 = SSL_read(pSVar6,local_348,0x14);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_360,
                                         "SSL_read(server_.get(), buf, sizeof(buf))","kChunkLen",
                                         &local_364,&TestBody::kChunkLen);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_360);
                              if (!bVar1) {
                                testing::Message::Message(&local_370);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_360);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x11ab,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_9.message_,&local_370);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_9.message_);
                                testing::Message::~Message(&local_370);
                              }
                              _uStack_fc = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_360);
                              if (_uStack_fc != 0) goto LAB_001cca0b;
                              local_38c = ::OPENSSL_memcmp(local_348,"hello",5);
                              local_390 = 0;
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_388,
                                         "OPENSSL_memcmp(buf, \"hello\", kChunkLen)","0",&local_38c,
                                         &local_390);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_388);
                              if (!bVar1) {
                                testing::Message::Message(&local_398);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_388);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)(data_longer + 3),kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x11ac,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)(data_longer + 3),&local_398);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)(data_longer + 3));
                                testing::Message::~Message(&local_398);
                              }
                              _uStack_fc = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_388);
                              if (_uStack_fc != 0) goto LAB_001cca0b;
                            }
                            stack0xfffffffffffffc55 = 0x2121215f5f5f5f5f;
                            data_longer[0] = '!';
                            data_longer[1] = '!';
                            data_longer[2] = '\0';
                            if ((gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._7_1_ & 1) == 0) {
                              pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                        (&(this->super_SSLVersionTest).client_);
                              local_414 = SSL_write(pSVar6,(void *)((long)&gtest_ar_10.message_._M_t
                                                                           .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 5),10);
                              local_418 = 10;
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_410,
                                         "SSL_write(client_.get(), data_longer, 2 * kChunkLen)",
                                         "2 * kChunkLen",&local_414,&local_418);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_410);
                              if (!bVar1) {
                                testing::Message::Message(&local_420);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_410);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x11bb,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_13.message_,&local_420);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_13.message_);
                                testing::Message::~Message(&local_420);
                              }
                              _uStack_fc = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_410);
                            }
                            else {
                              pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                        (&(this->super_SSLVersionTest).client_);
                              local_3c4 = SSL_write(pSVar6,(void *)((long)&gtest_ar_10.message_._M_t
                                                                           .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 5),10);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_3c0,
                                         "SSL_write(client_.get(), data_longer, 2 * kChunkLen)",
                                         "kChunkLen",&local_3c4,&TestBody::kChunkLen);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3c0);
                              if (!bVar1) {
                                testing::Message::Message(&local_3d0);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3c0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x11b6,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_11.message_,&local_3d0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_11.message_);
                                testing::Message::~Message(&local_3d0);
                              }
                              _uStack_fc = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3c0);
                              if (_uStack_fc != 0) goto LAB_001cca0b;
                              pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                        (&(this->super_SSLVersionTest).client_);
                              local_3ec = SSL_write(pSVar6,&stack0xfffffffffffffc5a,5);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_3e8,
                                         "SSL_write(client_.get(), data_longer + kChunkLen, kChunkLen)"
                                         ,"kChunkLen",&local_3ec,&TestBody::kChunkLen);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3e8);
                              if (!bVar1) {
                                testing::Message::Message(&local_3f8);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3e8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x11b8,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_12.message_,&local_3f8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_12.message_);
                                testing::Message::~Message(&local_3f8);
                              }
                              _uStack_fc = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3e8);
                            }
                            if (_uStack_fc == 0) {
                              pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                        (&(this->super_SSLVersionTest).server_);
                              local_43c = SSL_read(pSVar6,local_348,0x14);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_438,
                                         "SSL_read(server_.get(), buf, sizeof(buf))","kChunkLen",
                                         &local_43c,&TestBody::kChunkLen);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_438);
                              if (!bVar1) {
                                testing::Message::Message(&local_448);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_438);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x11c0,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_14.message_,&local_448);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_14.message_);
                                testing::Message::~Message(&local_448);
                              }
                              _uStack_fc = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_438);
                              if (_uStack_fc == 0) {
                                local_464 = ::OPENSSL_memcmp(local_348,"hello",5);
                                local_468 = 0;
                                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                          ((EqHelper *)local_460,
                                           "OPENSSL_memcmp(buf, \"hello\", kChunkLen)","0",
                                           &local_464,&local_468);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_460);
                                if (!bVar1) {
                                  testing::Message::Message(&local_470);
                                  pcVar4 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_460);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                             ,0x11c1,pcVar4);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_15.message_,&local_470);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_15.message_);
                                  testing::Message::~Message(&local_470);
                                }
                                _uStack_fc = (uint)!bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_460);
                                if (_uStack_fc == 0) {
                                  pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::
                                                  get(&(this->super_SSLVersionTest).server_);
                                  local_48c = SSL_read(pSVar6,local_348,0x14);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_488,
                                             "SSL_read(server_.get(), buf, sizeof(buf))","kChunkLen"
                                             ,&local_48c,&TestBody::kChunkLen);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_488);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_498);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_488);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_16.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                               ,0x11c2,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_16.message_,&local_498);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_16.message_);
                                    testing::Message::~Message(&local_498);
                                  }
                                  _uStack_fc = (uint)!bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_488);
                                  if (_uStack_fc == 0) {
                                    local_4b4 = ::OPENSSL_memcmp(local_348,"!!!!!",5);
                                    local_4b8 = 0;
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_4b0,
                                               "OPENSSL_memcmp(buf, \"!!!!!\", kChunkLen)","0",
                                               &local_4b4,&local_4b8);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_4b0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_4c0);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_4b0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&stack0xfffffffffffffb38,
                                                 kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                 ,0x11c3,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&stack0xfffffffffffffb38,&local_4c0
                                                );
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&stack0xfffffffffffffb38);
                                      testing::Message::~Message(&local_4c0);
                                    }
                                    _uStack_fc = (uint)!bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_4b0);
                                    if (_uStack_fc == 0) {
                                      local_108 = 0;
                                      while( true ) {
                                        pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).client_);
                                        gtest_ar_17.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ =
                                             SSL_write(pSVar6,(void *)((long)&ret_1 + 1),5);
                                        if (gtest_ar_17.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ < 1) break;
                                        local_50c = 5;
                                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                  ((EqHelper *)local_508,"ret","5",
                                                   (int *)((long)&gtest_ar_17.message_._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),&local_50c);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_508);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_518);
                                          pcVar4 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_508);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_19.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11ce,pcVar4);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_19.message_,
                                                     &local_518);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_19.message_);
                                          testing::Message::~Message(&local_518);
                                        }
                                        _uStack_fc = (uint)!bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_508);
                                        if (_uStack_fc != 0) goto LAB_001cca0b;
                                        local_108 = local_108 + 1;
                                      }
                                      pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).client_);
                                      local_4e4 = SSL_get_error(pSVar6,gtest_ar_17.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_);
                                      local_4e8 = 3;
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_4e0,
                                                 "SSL_get_error(client_.get(), ret)","3",&local_4e4,
                                                 &local_4e8);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_4e0);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_4f0);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_4e0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_18.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11cb,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_18.message_,&local_4f0)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_18.message_);
                                        testing::Message::~Message(&local_4f0);
                                      }
                                      _uStack_fc = (uint)!bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_4e0);
                                      if (_uStack_fc == 0) {
                                        pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).server_);
                                        local_534 = SSL_read(pSVar6,local_348,0x14);
                                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                  ((EqHelper *)local_530,
                                                   "SSL_read(server_.get(), buf, sizeof(buf))",
                                                   "kChunkLen",&local_534,&TestBody::kChunkLen);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_530);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_540);
                                          pcVar4 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_530);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_20.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11d1,pcVar4);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_20.message_,
                                                     &local_540);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_20.message_);
                                          testing::Message::~Message(&local_540);
                                        }
                                        _uStack_fc = (uint)!bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_530);
                                        if (_uStack_fc == 0) {
                                          local_55c = ::OPENSSL_memcmp(local_348,"hello",5);
                                          local_560 = 0;
                                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                    ((EqHelper *)local_558,
                                                     "OPENSSL_memcmp(buf, \"hello\", kChunkLen)","0"
                                                     ,&local_55c,&local_560);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_558);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_568);
                                            pcVar4 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_558);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&stack0xfffffffffffffa90,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11d2,pcVar4);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&stack0xfffffffffffffa90,
                                                       &local_568);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&stack0xfffffffffffffa90);
                                            testing::Message::~Message(&local_568);
                                          }
                                          _uStack_fc = (uint)!bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_558);
                                          if (_uStack_fc == 0) {
                                            pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).client_);
                                            gtest_ar_21.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ =
                                                 SSL_write(pSVar6,(void *)((long)&gtest_ar_10.
                                                                                  message_._M_t.
                                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 5),10);
                                            if ((gtest_ar_.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._7_1_ & 1) == 0) {
                                              local_624 = -1;
                                              testing::internal::EqHelper::
                                              Compare<int,_int,_nullptr>
                                                        ((EqHelper *)local_620,"ret","-1",
                                                         (int *)((long)&gtest_ar_21.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),&local_624);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_620);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_630);
                                                pcVar4 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_620);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_26.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11e8,pcVar4);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_26.message_,
                                                           &local_630);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_26.message_);
                                                testing::Message::~Message(&local_630);
                                              }
                                              _uStack_fc = (uint)!bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_620);
                                              if (_uStack_fc == 0) {
                                                pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).client_);
                                                local_64c = SSL_get_error(pSVar6,-1);
                                                local_650 = 3;
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_648,
                                                           "SSL_get_error(client_.get(), -1)","3",
                                                           &local_64c,&local_650);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_648);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_658);
                                                  pcVar4 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_648);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_27.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11e9,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_27.message_,
                                                             &local_658);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_27.message_);
                                                  testing::Message::~Message(&local_658);
                                                }
                                                _uStack_fc = (uint)!bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_648);
                                                if (_uStack_fc == 0) {
                                                  pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).server_);
                                                  local_674 = SSL_read(pSVar6,local_348,0x14);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_670,
                                                                                                                          
                                                  "SSL_read(server_.get(), buf, sizeof(buf))",
                                                  "kChunkLen",&local_674,&TestBody::kChunkLen);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_670);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_680);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_670);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_28.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11ec,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_28.message_,
                                                             &local_680);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_28.message_);
                                                  testing::Message::~Message(&local_680);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_670);
                                                  if (_uStack_fc == 0) {
                                                    local_69c = ::OPENSSL_memcmp(local_348,"hello",5
                                                                                );
                                                    local_6a0 = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((EqHelper *)local_698,
                                                                                                                              
                                                  "OPENSSL_memcmp(buf, \"hello\", kChunkLen)","0",
                                                  &local_69c,&local_6a0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_698);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_6a8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_698);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_29.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11ed,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_29.message_,
                                                             &local_6a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_29.message_);
                                                  testing::Message::~Message(&local_6a8);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_698);
                                                  if (_uStack_fc == 0) {
                                                    pUVar8 = &(this->super_SSLVersionTest).client_;
                                                    pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (pUVar8);
                                                  pSVar7 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (pUVar8);
                                                  iVar2 = SSL_write(pSVar7,(void *)((long)&
                                                  gtest_ar_10.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 5),4);
                                                  local_6c4 = SSL_get_error(pSVar6,iVar2);
                                                  local_6c8 = 1;
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_6c0,
                                                                                                                          
                                                  "SSL_get_error(client_.get(), SSL_write(client_.get(), data_longer, kChunkLen - 1))"
                                                  ,"1",&local_6c4,&local_6c8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_6c0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_6d0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_6c0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar__4.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11f8,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__4.message_,
                                                             &local_6d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__4.message_);
                                                  testing::Message::~Message(&local_6d0);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6c0);
                                                  if (_uStack_fc == 0) {
                                                    local_6e9 = ExpectSingleError(0x10,0x6f);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_6e8,
                                                               &local_6e9,(type *)0x0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6e8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_6f8);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar_30.message_,
                                                                 (internal *)local_6e8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "ExpectSingleError(ERR_LIB_SSL, 111)","false",
                                                  "true",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_700,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11f9,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_700,&local_6f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_700);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_30.message_);
                                                  testing::Message::~Message(&local_6f8);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6e8);
                                                  if (_uStack_fc == 0) {
                                                    pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).client_);
                                                  local_734 = SSL_write(pSVar6,(void *)((long)&
                                                  gtest_ar_10.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 5),10);
                                                  local_738 = 10;
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_730,
                                                                                                                          
                                                  "SSL_write(client_.get(), data_longer, 2 * kChunkLen)"
                                                  ,"2 * kChunkLen",&local_734,&local_738);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_730);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_740);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_730);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)
                                                               &stack0xfffffffffffff8b8,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11fd,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)
                                                             &stack0xfffffffffffff8b8,&local_740);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)
                                                             &stack0xfffffffffffff8b8);
                                                  testing::Message::~Message(&local_740);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_730);
                                                  goto joined_r0x001cc0ba;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              testing::internal::EqHelper::
                                              Compare<int,_int,_nullptr>
                                                        ((EqHelper *)local_588,"ret","kChunkLen",
                                                         (int *)((long)&gtest_ar_21.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),&TestBody::kChunkLen);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_588);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_590);
                                                pcVar4 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_588);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_22.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11db,pcVar4);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_22.message_,
                                                           &local_590);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_22.message_);
                                                testing::Message::~Message(&local_590);
                                              }
                                              _uStack_fc = (uint)!bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_588);
                                              if (_uStack_fc == 0) {
                                                pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).server_);
                                                local_5ac = SSL_read(pSVar6,local_348,0x14);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_5a8,
                                                                                                                      
                                                  "SSL_read(server_.get(), buf, sizeof(buf))",
                                                  "kChunkLen",&local_5ac,&TestBody::kChunkLen);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_5a8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_5b8);
                                                  pcVar4 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_5a8);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_23.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11de,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_23.message_,
                                                             &local_5b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_23.message_);
                                                  testing::Message::~Message(&local_5b8);
                                                }
                                                _uStack_fc = (uint)!bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_5a8);
                                                if (_uStack_fc == 0) {
                                                  local_5d4 = ::OPENSSL_memcmp(local_348,"hello",5);
                                                  local_5d8 = 0;
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_5d0,
                                                                                                                          
                                                  "OPENSSL_memcmp(buf, \"hello\", kChunkLen)","0",
                                                  &local_5d4,&local_5d8);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_5d0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_5e0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_5d0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_24.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11df,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_24.message_,
                                                             &local_5e0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_24.message_);
                                                  testing::Message::~Message(&local_5e0);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5d0);
                                                  if (_uStack_fc == 0) {
                                                    pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).client_);
                                                  local_5fc = SSL_write(pSVar6,&
                                                  stack0xfffffffffffffc5a,5);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_5f8,
                                                                                                                          
                                                  "SSL_write(client_.get(), data_longer + kChunkLen, kChunkLen)"
                                                  ,"kChunkLen",&local_5fc,&TestBody::kChunkLen);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_5f8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_608);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_5f8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_25.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x11e4,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_25.message_,
                                                             &local_608);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_25.message_);
                                                  testing::Message::~Message(&local_608);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5f8);
joined_r0x001cc0ba:
                                                  if (_uStack_fc == 0) {
                                                    local_108 = local_108 - 2;
                                                    _uStack_fc = 0;
                                                    for (gtest_ar_31.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ = 0;
                                                  gtest_ar_31.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ < local_108;
                                                  gtest_ar_31.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ =
                                                       gtest_ar_31.message_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ + 1) {
                                                    pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).server_);
                                                  local_764 = SSL_read(pSVar6,local_348,0x14);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_760,
                                                                                                                          
                                                  "SSL_read(server_.get(), buf, sizeof(buf))",
                                                  "kChunkLen",&local_764,&TestBody::kChunkLen);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_760);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_770);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_760);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_32.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x1202,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_32.message_,
                                                             &local_770);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_32.message_);
                                                  testing::Message::~Message(&local_770);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_760);
                                                  if (_uStack_fc != 0) goto LAB_001cca0b;
                                                  local_78c = ::OPENSSL_memcmp(local_348,"hello",5);
                                                  local_790 = 0;
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_788,
                                                                                                                          
                                                  "OPENSSL_memcmp(buf, \"hello\", kChunkLen)","0",
                                                  &local_78c,&local_790);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_788);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_798);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_788);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_33.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x1203,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_33.message_,
                                                             &local_798);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_33.message_);
                                                  testing::Message::~Message(&local_798);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_788);
                                                  if (_uStack_fc != 0) goto LAB_001cca0b;
                                                  }
                                                  pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).server_);
                                                  local_7b4 = SSL_read(pSVar6,local_348,0x14);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_7b0,
                                                                                                                          
                                                  "SSL_read(server_.get(), buf, sizeof(buf))",
                                                  "kChunkLen",&local_7b4,&TestBody::kChunkLen);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_7b0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_7c0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_7b0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_34.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x1207,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_34.message_,
                                                             &local_7c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_34.message_);
                                                  testing::Message::~Message(&local_7c0);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7b0);
                                                  if (_uStack_fc == 0) {
                                                    local_7dc = ::OPENSSL_memcmp(local_348,"hello",5
                                                                                );
                                                    local_7e0 = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((EqHelper *)local_7d8,
                                                                                                                              
                                                  "OPENSSL_memcmp(buf, \"hello\", kChunkLen)","0",
                                                  &local_7dc,&local_7e0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_7d8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_7e8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_7d8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_35.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x1208,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_35.message_,
                                                             &local_7e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_35.message_);
                                                  testing::Message::~Message(&local_7e8);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7d8);
                                                  if (_uStack_fc == 0) {
                                                    pSVar6 = (SSL *)std::
                                                  unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                            (&(this->super_SSLVersionTest).server_);
                                                  local_804 = SSL_read(pSVar6,local_348,0x14);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_800,
                                                                                                                          
                                                  "SSL_read(server_.get(), buf, sizeof(buf))",
                                                  "kChunkLen",&local_804,&TestBody::kChunkLen);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_800);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_810);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_800);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_36.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x1209,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_36.message_,
                                                             &local_810);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_36.message_);
                                                  testing::Message::~Message(&local_810);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_800);
                                                  if (_uStack_fc == 0) {
                                                    local_82c = ::OPENSSL_memcmp(local_348,"!!!!!",5
                                                                                );
                                                    local_830 = 0;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((EqHelper *)local_828,
                                                                                                                              
                                                  "OPENSSL_memcmp(buf, \"!!!!!\", kChunkLen)","0",
                                                  &local_82c,&local_830);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_828);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_838);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_828);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_840,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                                  ,0x120a,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_840,&local_838);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_840);
                                                  testing::Message::~Message(&local_838);
                                                  }
                                                  _uStack_fc = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_828);
                                                  if (_uStack_fc == 0) {
                                                    _uStack_fc = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_001cca0b:
      testing::ScopedTrace::~ScopedTrace
                ((ScopedTrace *)
                 ((long)&gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 6));
      if (_uStack_fc != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, SSLWriteRetry) {
  if (is_dtls()) {
    return;
  }

  for (bool enable_partial_write : {false, true}) {
    SCOPED_TRACE(enable_partial_write);

    // Connect a client and server.
    ASSERT_TRUE(Connect());

    if (enable_partial_write) {
      SSL_set_mode(client_.get(), SSL_MODE_ENABLE_PARTIAL_WRITE);
    }

    // Write without reading until the buffer is full and we have an unfinished
    // write. Keep a count so we may reread it again later. "hello!" will be
    // written in two chunks, "hello" and "!".
    char data[] = "hello!";
    static const int kChunkLen = 5;  // The length of "hello".
    unsigned count = 0;
    for (;;) {
      int ret = SSL_write(client_.get(), data, kChunkLen);
      if (ret <= 0) {
        ASSERT_EQ(SSL_get_error(client_.get(), ret), SSL_ERROR_WANT_WRITE);
        break;
      }
      ASSERT_EQ(ret, 5);
      count++;
    }

    // Retrying with the same parameters is legal.
    ASSERT_EQ(
        SSL_get_error(client_.get(), SSL_write(client_.get(), data, kChunkLen)),
        SSL_ERROR_WANT_WRITE);

    // Retrying with the same buffer but shorter length is not legal.
    ASSERT_EQ(SSL_get_error(client_.get(),
                            SSL_write(client_.get(), data, kChunkLen - 1)),
              SSL_ERROR_SSL);
    ASSERT_TRUE(ExpectSingleError(ERR_LIB_SSL, SSL_R_BAD_WRITE_RETRY));

    // Retrying with a different buffer pointer is not legal.
    char data2[] = "hello";
    ASSERT_EQ(SSL_get_error(client_.get(),
                            SSL_write(client_.get(), data2, kChunkLen)),
              SSL_ERROR_SSL);
    ASSERT_TRUE(ExpectSingleError(ERR_LIB_SSL, SSL_R_BAD_WRITE_RETRY));

    // With |SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER|, the buffer may move.
    SSL_set_mode(client_.get(), SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER);
    ASSERT_EQ(SSL_get_error(client_.get(),
                            SSL_write(client_.get(), data2, kChunkLen)),
              SSL_ERROR_WANT_WRITE);

    // |SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER| does not disable length checks.
    ASSERT_EQ(SSL_get_error(client_.get(),
                            SSL_write(client_.get(), data2, kChunkLen - 1)),
              SSL_ERROR_SSL);
    ASSERT_TRUE(ExpectSingleError(ERR_LIB_SSL, SSL_R_BAD_WRITE_RETRY));

    // Retrying with a larger buffer is legal.
    ASSERT_EQ(SSL_get_error(client_.get(),
                            SSL_write(client_.get(), data, kChunkLen + 1)),
              SSL_ERROR_WANT_WRITE);

    // Drain the buffer.
    char buf[20];
    for (unsigned i = 0; i < count; i++) {
      ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
      ASSERT_EQ(OPENSSL_memcmp(buf, "hello", kChunkLen), 0);
    }

    // Now that there is space, a retry with a larger buffer should flush the
    // pending record, skip over that many bytes of input (on assumption they
    // are the same), and write the remainder. If SSL_MODE_ENABLE_PARTIAL_WRITE
    // is set, this will complete in two steps.
    char data_longer[] = "_____!!!!!";
    if (enable_partial_write) {
      ASSERT_EQ(SSL_write(client_.get(), data_longer, 2 * kChunkLen),
                kChunkLen);
      ASSERT_EQ(SSL_write(client_.get(), data_longer + kChunkLen, kChunkLen),
                kChunkLen);
    } else {
      ASSERT_EQ(SSL_write(client_.get(), data_longer, 2 * kChunkLen),
                2 * kChunkLen);
    }

    // Check the last write was correct. The data will be spread over two
    // records, so SSL_read returns twice.
    ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
    ASSERT_EQ(OPENSSL_memcmp(buf, "hello", kChunkLen), 0);
    ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
    ASSERT_EQ(OPENSSL_memcmp(buf, "!!!!!", kChunkLen), 0);

    // Fill the transport buffer again. This time only leave room for one
    // record.
    count = 0;
    for (;;) {
      int ret = SSL_write(client_.get(), data, kChunkLen);
      if (ret <= 0) {
        ASSERT_EQ(SSL_get_error(client_.get(), ret), SSL_ERROR_WANT_WRITE);
        break;
      }
      ASSERT_EQ(ret, 5);
      count++;
    }
    ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
    ASSERT_EQ(OPENSSL_memcmp(buf, "hello", kChunkLen), 0);
    count--;

    // Retry the last write, with a longer input. The first half is the most
    // recently failed write, from filling the buffer. |SSL_write| should write
    // that to the transport, and then attempt to write the second half.
    int ret = SSL_write(client_.get(), data_longer, 2 * kChunkLen);
    if (enable_partial_write) {
      // If partial writes are allowed, the write will succeed partially.
      ASSERT_EQ(ret, kChunkLen);

      // Check the first half and make room for another record.
      ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
      ASSERT_EQ(OPENSSL_memcmp(buf, "hello", kChunkLen), 0);
      count--;

      // Finish writing the input.
      ASSERT_EQ(SSL_write(client_.get(), data_longer + kChunkLen, kChunkLen),
                kChunkLen);
    } else {
      // Otherwise, although the first half made it to the transport, the second
      // half is blocked.
      ASSERT_EQ(ret, -1);
      ASSERT_EQ(SSL_get_error(client_.get(), -1), SSL_ERROR_WANT_WRITE);

      // Check the first half and make room for another record.
      ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
      ASSERT_EQ(OPENSSL_memcmp(buf, "hello", kChunkLen), 0);
      count--;

      // Retrying with fewer bytes than previously attempted is an error. If the
      // input length is less than the number of bytes successfully written, the
      // check happens at a different point, with a different error.
      //
      // TODO(davidben): Should these cases use the same error?
      ASSERT_EQ(
          SSL_get_error(client_.get(),
                        SSL_write(client_.get(), data_longer, kChunkLen - 1)),
          SSL_ERROR_SSL);
      ASSERT_TRUE(ExpectSingleError(ERR_LIB_SSL, SSL_R_BAD_LENGTH));

      // Complete the write with the correct retry.
      ASSERT_EQ(SSL_write(client_.get(), data_longer, 2 * kChunkLen),
                2 * kChunkLen);
    }

    // Drain the input and ensure everything was written correctly.
    for (unsigned i = 0; i < count; i++) {
      ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
      ASSERT_EQ(OPENSSL_memcmp(buf, "hello", kChunkLen), 0);
    }

    // The final write is spread over two records.
    ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
    ASSERT_EQ(OPENSSL_memcmp(buf, "hello", kChunkLen), 0);
    ASSERT_EQ(SSL_read(server_.get(), buf, sizeof(buf)), kChunkLen);
    ASSERT_EQ(OPENSSL_memcmp(buf, "!!!!!", kChunkLen), 0);
  }
}